

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,Ptr<const_Catch::IConfig> *_fullConfig)

{
  int iVar1;
  IConfig *pIVar2;
  undefined4 extraout_var;
  Ptr<const_Catch::IConfig> *_fullConfig_local;
  ReporterConfig *this_local;
  
  pIVar2 = Ptr<const_Catch::IConfig>::operator->(_fullConfig);
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
  this->m_stream = (ostream *)CONCAT44(extraout_var,iVar1);
  Ptr<const_Catch::IConfig>::Ptr(&this->m_fullConfig,_fullConfig);
  return;
}

Assistant:

explicit ReporterConfig( Ptr<IConfig const> const& _fullConfig )
        :   m_stream( &_fullConfig->stream() ), m_fullConfig( _fullConfig ) {}